

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loggingTest2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  LogTest2 *pLVar1;
  TestRunner runner;
  TestCase *test_set [10];
  TestRunner local_69;
  LogTest2 *local_68;
  LogTest2 *local_60;
  LogTest2 *local_58;
  
  TestRunner::TestRunner(&local_69,*argv);
  pLVar1 = (LogTest2 *)
           operator_new(0x128,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
                        ,0xa3);
  LogTest2::LogTest2(pLVar1,1);
  local_68 = pLVar1;
  pLVar1 = (LogTest2 *)
           operator_new(0x128,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
                        ,0xa4);
  LogTest2::LogTest2(pLVar1,2);
  local_60 = pLVar1;
  pLVar1 = (LogTest2 *)
           operator_new(0x128,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
                        ,0xa5);
  LogTest2::LogTest2(pLVar1,3);
  local_58 = pLVar1;
  TestRunner::RunAll(&local_69,(TestCase **)&local_68,3);
  return 0;
}

Assistant:

int main( int argc, char* argv[] )
{
	TestRunner runner( argv[ 0 ] );
	TestCase* test_set[ 10 ];

	test_set[ 0 ] = jh_new LogTest2( 1 );
	test_set[ 1 ] = jh_new LogTest2( 2 );
	test_set[ 2 ] = jh_new LogTest2( 3 );

	runner.RunAll( test_set, 3 );
	
	
	return 0;



}